

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  ZSTD_matchState_t *pZVar4;
  BYTE *pBVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  char cVar18;
  uint uVar19;
  uint *puVar20;
  long lVar21;
  ulong *puVar22;
  uint *puVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint *puVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  BYTE *pInLoopLimit_1;
  BYTE *pBVar31;
  int iVar32;
  ulong *puVar33;
  ulong uVar34;
  uint uVar35;
  BYTE *pBVar36;
  ulong *puVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  U32 UVar41;
  uint uVar42;
  uint uVar43;
  U32 *pUVar44;
  BYTE *pInLoopLimit;
  U32 dummy32;
  uint local_124;
  uint *local_118;
  BYTE *local_f8;
  ulong local_e0;
  uint local_68;
  uint local_64;
  U32 *local_60;
  ulong local_58;
  U32 *local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  uVar24 = (ms->cParams).hashLog;
  if (0x20 < uVar24) goto LAB_001b1749;
  local_58 = (ulong)(mls - 5);
  cVar18 = (char)uVar24;
  switch(local_58) {
  case 0:
    lVar21 = -0x30e4432345000000;
    break;
  case 1:
    lVar21 = -0x30e4432340650000;
    break;
  case 2:
    lVar21 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar8 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_001b0b33;
  default:
    uVar8 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar18 & 0x1fU));
    goto LAB_001b0b38;
  }
  uVar8 = lVar21 * *(long *)ip;
LAB_001b0b33:
  uVar8 = uVar8 >> (-cVar18 & 0x3fU);
LAB_001b0b38:
  pBVar3 = (ms->window).base;
  uVar38 = (int)ip - (int)pBVar3;
  UVar2 = (ms->window).lowLimit;
  uVar24 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar41 = uVar38 - uVar24;
  if (uVar38 - UVar2 <= uVar24) {
    UVar41 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar41 = UVar2;
  }
  uVar42 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar24 = uVar38 - uVar42;
  if (uVar38 < uVar42) {
    uVar24 = 0;
  }
  uVar30 = UVar41;
  if (UVar41 < uVar24) {
    uVar30 = uVar24;
  }
  local_124 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747c,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_50 = ms->hashTable;
  pUVar44 = ms->chainTable;
  uVar43 = local_50[uVar8];
  local_60 = pUVar44;
  if (uVar30 < uVar43) {
    uVar34 = 0;
    uVar28 = local_124;
    do {
      uVar9 = (ulong)uVar43;
      uVar17 = (ulong)((uVar43 & uVar42) * 2);
      if ((pUVar44[uVar17 + 1] != 1) || (uVar28 < 2)) {
        if (pUVar44[uVar17 + 1] == 1) {
          (pUVar44 + uVar17)[0] = 0;
          (pUVar44 + uVar17)[1] = 0;
        }
        uVar9 = uVar34;
        if ((U32)uVar34 == 0) goto LAB_001b1022;
        break;
      }
      pUVar44[uVar17 + 1] = (U32)uVar34;
      uVar28 = uVar28 - 1;
      uVar43 = pUVar44[uVar17];
      uVar34 = uVar9;
    } while (uVar30 < uVar43);
    local_f8 = (ms->window).dictBase;
    do {
      uVar43 = (ms->window).dictLimit;
      uVar34 = (ulong)uVar43;
      local_38 = (ulong *)(local_f8 + uVar34);
      uVar25 = (uint)uVar9;
      puVar37 = (ulong *)iend;
      pBVar36 = pBVar3;
      if (uVar25 < uVar43) {
        puVar37 = local_38;
        pBVar36 = local_f8;
      }
      UVar2 = (ms->window).lowLimit;
      uVar35 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar40 = uVar25 - uVar35;
      if (uVar25 - UVar2 <= uVar35) {
        uVar40 = UVar2;
      }
      if (uVar25 < uVar30) {
        __assert_fail("curr >= btLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x73d4,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar22 = (ulong *)(pBVar36 + uVar9);
      if (puVar37 <= puVar22) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x73d5,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar35 = pUVar44[(ulong)((uVar25 & uVar42) * 2) + 1];
      uVar39 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar19 = (uVar25 & uVar39) * 2;
      local_118 = pUVar44 + uVar19;
      puVar20 = local_118 + 1;
      if ((uVar28 != 0) && (uVar19 = pUVar44[uVar19], uVar40 < uVar19)) {
        local_40 = pBVar3 + uVar34;
        local_48 = pBVar36 + uVar9 + 8;
        uVar17 = 0;
        uVar9 = 0;
        uVar29 = uVar28;
        do {
          uVar11 = uVar9;
          if (uVar17 < uVar9) {
            uVar11 = uVar17;
          }
          if (uVar25 <= uVar19) {
            __assert_fail("matchIndex < curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x73da,
                          "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          uVar15 = (ulong)uVar19;
          uVar12 = uVar11 + uVar15;
          pBVar36 = pBVar3;
          if (dictMode == ZSTD_extDict) {
            if ((uVar25 < uVar43) || (uVar34 <= uVar12)) {
              if (uVar12 < uVar34) {
                pBVar36 = local_f8;
              }
              goto LAB_001b0e4e;
            }
            sVar10 = ZSTD_count_2segments
                               ((byte *)((long)puVar22 + uVar11),local_f8 + uVar15 + uVar11,
                                (BYTE *)puVar37,(BYTE *)local_38,local_40);
            uVar11 = sVar10 + uVar11;
            pUVar44 = local_60;
            pBVar36 = pBVar3 + uVar15;
            if (uVar11 + uVar15 < uVar34) {
              pBVar36 = local_f8 + uVar15;
            }
          }
          else {
LAB_001b0e4e:
            if ((uVar43 <= uVar25) && (uVar12 < uVar34)) {
              __assert_fail("(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x73e6,
                            "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar16 = (ulong *)((long)puVar22 + uVar11);
            puVar33 = (ulong *)(pBVar36 + uVar15 + uVar11);
            puVar13 = puVar16;
            if (puVar16 < (ulong *)((long)puVar37 - 7U)) {
              if (*puVar33 == *puVar16) {
                lVar21 = 0;
                do {
                  puVar13 = (ulong *)(local_48 + lVar21 + uVar11);
                  if ((ulong *)((long)puVar37 - 7U) <= puVar13) {
                    puVar33 = (ulong *)(pBVar36 + lVar21 + uVar12 + 8);
                    goto LAB_001b0f03;
                  }
                  lVar7 = lVar21 + uVar12 + 8;
                  lVar21 = lVar21 + 8;
                } while (*(ulong *)(pBVar36 + lVar7) == *puVar13);
                uVar14 = *puVar13 ^ *(ulong *)(pBVar36 + lVar7);
                uVar12 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar12 = (uVar12 >> 3 & 0x1fffffff) + lVar21;
              }
              else {
                uVar14 = *puVar16 ^ *puVar33;
                uVar12 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar12 = uVar12 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_001b0f03:
              if ((puVar13 < (ulong *)((long)puVar37 - 3U)) && ((int)*puVar33 == (int)*puVar13)) {
                puVar13 = (ulong *)((long)puVar13 + 4);
                puVar33 = (ulong *)((long)puVar33 + 4);
              }
              if ((puVar13 < (ulong *)((long)puVar37 - 1U)) && ((short)*puVar33 == (short)*puVar13))
              {
                puVar13 = (ulong *)((long)puVar13 + 2);
                puVar33 = (ulong *)((long)puVar33 + 2);
              }
              if (puVar13 < puVar37) {
                puVar13 = (ulong *)((long)puVar13 + (ulong)((byte)*puVar33 == (byte)*puVar13));
              }
              uVar12 = (long)puVar13 - (long)puVar16;
            }
            uVar11 = uVar12 + uVar11;
            pBVar36 = pBVar36 + uVar15;
          }
          if ((ulong *)((long)puVar22 + uVar11) == puVar37) break;
          puVar23 = pUVar44 + (uVar19 & uVar39) * 2;
          if (pBVar36[uVar11] < (byte)*(ulong *)((long)puVar22 + uVar11)) {
            *local_118 = uVar19;
            if (uVar19 <= uVar30) {
              local_118 = &local_64;
              break;
            }
            puVar23 = puVar23 + 1;
            uVar17 = uVar11;
            local_118 = puVar23;
          }
          else {
            *puVar20 = uVar19;
            uVar9 = uVar11;
            puVar20 = puVar23;
            if (uVar19 <= uVar30) {
              puVar20 = &local_64;
              break;
            }
          }
          uVar29 = uVar29 - 1;
          if ((uVar29 == 0) || (uVar19 = *puVar23, uVar19 <= uVar40)) break;
        } while( true );
      }
      *puVar20 = 0;
      *local_118 = 0;
      uVar28 = uVar28 + 1;
      uVar9 = (ulong)uVar35;
    } while (uVar35 != 0);
  }
  else {
LAB_001b1022:
    local_f8 = (ms->window).dictBase;
  }
  uVar9 = (ulong)(ms->window).dictLimit;
  uVar34 = (ulong)((uVar42 & uVar38) * 2);
  puVar20 = pUVar44 + uVar34;
  puVar23 = pUVar44 + uVar34 + 1;
  uVar43 = uVar38 + 9;
  uVar30 = local_50[uVar8];
  local_50[uVar8] = uVar38;
  if (UVar41 < uVar30) {
    uVar8 = 0;
    uVar34 = 0;
    uVar17 = 0;
    do {
      uVar12 = (ulong)uVar30;
      uVar11 = uVar34;
      if (uVar17 < uVar34) {
        uVar11 = uVar17;
      }
      uVar15 = uVar12 + uVar11;
      puVar37 = (ulong *)(ip + uVar11);
      if ((dictMode == ZSTD_extDict) && (uVar15 < uVar9)) {
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)puVar37,local_f8 + uVar12 + uVar11,iend,local_f8 + uVar9,
                            pBVar3 + uVar9);
        uVar11 = sVar10 + uVar11;
        pBVar36 = pBVar3 + uVar12;
        if (uVar11 + uVar12 < uVar9) {
          pBVar36 = local_f8 + uVar12;
        }
      }
      else {
        puVar22 = (ulong *)(pBVar3 + uVar12 + uVar11);
        puVar16 = puVar37;
        if (puVar37 < iend + -7) {
          if (*puVar22 == *puVar37) {
            lVar21 = 0;
            do {
              puVar16 = (ulong *)(ip + lVar21 + uVar11 + 8);
              if (iend + -7 <= puVar16) {
                puVar22 = (ulong *)(pBVar3 + uVar15 + lVar21 + 8);
                goto LAB_001b1208;
              }
              lVar7 = lVar21 + uVar15 + 8;
              lVar21 = lVar21 + 8;
            } while (*(ulong *)(pBVar3 + lVar7) == *puVar16);
            uVar14 = *puVar16 ^ *(ulong *)(pBVar3 + lVar7);
            uVar15 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = (uVar15 >> 3 & 0x1fffffff) + lVar21;
          }
          else {
            uVar14 = *puVar37 ^ *puVar22;
            uVar15 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001b1208:
          if ((puVar16 < iend + -3) && ((int)*puVar22 == (int)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 4);
            puVar22 = (ulong *)((long)puVar22 + 4);
          }
          if ((puVar16 < iend + -1) && ((short)*puVar22 == (short)*puVar16)) {
            puVar16 = (ulong *)((long)puVar16 + 2);
            puVar22 = (ulong *)((long)puVar22 + 2);
          }
          if (puVar16 < iend) {
            puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar22 == (char)*puVar16));
          }
          uVar15 = (long)puVar16 - (long)puVar37;
        }
        uVar11 = uVar15 + uVar11;
        pBVar36 = pBVar3 + uVar12;
      }
      if (uVar8 < uVar11) {
        if (uVar43 - uVar30 < uVar11) {
          uVar43 = uVar30 + (int)uVar11;
        }
        uVar28 = (uVar38 - uVar30) + 1;
        iVar32 = 0x1f;
        if (uVar28 != 0) {
          for (; uVar28 >> iVar32 == 0; iVar32 = iVar32 + -1) {
          }
        }
        iVar26 = 0x1f;
        if ((int)*offBasePtr != 0) {
          for (; (uint)*offBasePtr >> iVar26 == 0; iVar26 = iVar26 + -1) {
          }
        }
        if (iVar32 - iVar26 < ((int)uVar11 - (int)uVar8) * 4) {
          if (uVar38 == uVar30) {
            __assert_fail("(curr - matchIndex)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x74c2,
                          "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          *offBasePtr = (ulong)((uVar38 - uVar30) + 3);
          uVar8 = uVar11;
        }
        if (ip + uVar11 == iend) {
          if (dictMode == ZSTD_dictMatchState) {
            *puVar23 = 0;
            *puVar20 = 0;
            goto LAB_001b165a;
          }
          goto LAB_001b1384;
        }
      }
      puVar27 = local_60 + (uVar30 & uVar42) * 2;
      if (pBVar36[uVar11] < ip[uVar11]) {
        *puVar20 = uVar30;
        if (uVar30 <= uVar24) {
          puVar20 = &local_68;
          goto LAB_001b1384;
        }
        puVar27 = puVar27 + 1;
        uVar17 = uVar11;
        puVar20 = puVar27;
      }
      else {
        *puVar23 = uVar30;
        uVar34 = uVar11;
        puVar23 = puVar27;
        if (uVar30 <= uVar24) {
          puVar23 = &local_68;
          goto LAB_001b1384;
        }
      }
      local_124 = local_124 - 1;
      if ((local_124 == 0) || (uVar30 = *puVar27, uVar30 <= UVar41)) goto LAB_001b1384;
    } while( true );
  }
  uVar8 = 0;
LAB_001b1384:
  *puVar23 = 0;
  *puVar20 = 0;
  if (0x40000000 < local_124) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74df,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((dictMode == ZSTD_dictMatchState) && (local_124 != 0)) {
    pZVar4 = ms->dictMatchState;
    uVar24 = (pZVar4->cParams).hashLog;
    if (0x20 < uVar24) {
LAB_001b1749:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    if ((uint)local_58 < 4) {
      sVar10 = (*(code *)(&DAT_002662e0 + *(int *)(&DAT_002662e0 + local_58 * 4)))
                         (&DAT_002662e0 + *(int *)(&DAT_002662e0 + local_58 * 4));
      return sVar10;
    }
    pBVar36 = (pZVar4->window).nextSrc;
    pBVar5 = (pZVar4->window).base;
    uVar34 = (long)pBVar36 - (long)pBVar5;
    uVar42 = (pZVar4->window).lowLimit;
    uVar28 = ~(-1 << ((char)(pZVar4->cParams).chainLog - 1U & 0x1f));
    iVar32 = (int)uVar34;
    uVar30 = iVar32 - uVar28;
    if (iVar32 - uVar42 <= uVar28) {
      uVar30 = uVar42;
    }
    uVar24 = pZVar4->hashTable[(uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar24 & 0x1fU)];
    if (uVar42 < uVar24) {
      uVar25 = (ms->window).dictLimit;
      uVar40 = (ms->window).lowLimit - iVar32;
      pUVar44 = pZVar4->chainTable;
      uVar9 = 0;
      local_e0 = 0;
      do {
        local_124 = local_124 - 1;
        uVar17 = uVar9;
        if (local_e0 < uVar9) {
          uVar17 = local_e0;
        }
        uVar11 = (ulong)uVar24;
        pBVar1 = pBVar5 + uVar11;
        sVar10 = ZSTD_count_2segments(ip + uVar17,pBVar1 + uVar17,iend,pBVar36,pBVar3 + uVar25);
        uVar17 = sVar10 + uVar17;
        pBVar31 = pBVar3 + uVar11 + uVar40;
        if (uVar17 + uVar11 < (uVar34 & 0xffffffff)) {
          pBVar31 = pBVar1;
        }
        if (uVar8 < uVar17) {
          uVar19 = uVar40 + uVar24;
          iVar26 = uVar38 - uVar19;
          uVar35 = iVar26 + 1;
          iVar32 = 0x1f;
          if (uVar35 != 0) {
            for (; uVar35 >> iVar32 == 0; iVar32 = iVar32 + -1) {
            }
          }
          uVar35 = (int)*offBasePtr + 1;
          iVar6 = 0x1f;
          if (uVar35 != 0) {
            for (; uVar35 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          if (iVar32 - iVar6 < ((int)uVar17 - (int)uVar8) * 4) {
            if (uVar38 == uVar19) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7440,
                            "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                           );
            }
            *offBasePtr = (ulong)(iVar26 + 3);
            uVar8 = uVar17;
          }
          if (ip + uVar17 == iend) break;
        }
        puVar20 = pUVar44 + (uVar24 & uVar28) * 2;
        if (pBVar31[uVar17] < ip[uVar17]) {
          if (uVar24 <= uVar30) break;
          puVar20 = puVar20 + 1;
          local_e0 = uVar17;
        }
        else {
          uVar9 = uVar17;
          if (uVar24 <= uVar30) break;
        }
        if ((local_124 == 0) || (uVar24 = *puVar20, uVar24 <= uVar42)) break;
      } while( true );
    }
    if ((2 < uVar8) && (*offBasePtr < 4)) {
      __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7454,
                    "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
LAB_001b165a:
  if (uVar43 <= uVar38 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74e7,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar43 - 8;
  if ((2 < uVar8) && (*offBasePtr < 4)) {
    __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74ea,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  return uVar8;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}